

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
CompatibleTypes<proto2_unittest::TestAllTypes>::TestBody
          (CompatibleTypes<proto2_unittest::TestAllTypes> *this)

{
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  AssertionResult gtest_ar__3;
  Uint32Message msg5;
  AssertionResult gtest_ar__2;
  Int32Message msg4;
  Uint64Message msg3;
  string serialized;
  BoolMessage msg2;
  Int64Message msg1;
  AssertHelper local_120;
  AssertHelper local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  undefined1 local_108 [8];
  InternalMetadata local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [8];
  InternalMetadata local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [8];
  InternalMetadata local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  AssertHelper local_88;
  string local_80;
  BoolMessage local_60;
  Int64Message local_40;
  
  proto2_unittest::Int64Message::Int64Message(&local_40,(Arena *)0x0);
  local_40.field_0._impl_.data_ = 0x100000000;
  local_40.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_40.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  MessageLite::SerializeToString((MessageLite *)&local_40,&local_80);
  proto2_unittest::BoolMessage::BoolMessage(&local_60,(Arena *)0x0);
  data._M_str = local_80._M_dataplus._M_p;
  data._M_len = local_80._M_string_length;
  iVar1 = (internal)MessageLite::ParseFromString((MessageLite *)&local_60,data);
  local_c0.ptr_ = 0;
  if (!(bool)iVar1) {
    local_c8[0] = iVar1;
    testing::Message::Message((Message *)local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_c8,
               (AssertionResult *)"msg2.ParseFromString(serialized)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x432,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1);
    }
    if (local_108 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_108 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_c0.ptr_);
    }
    if (!(bool)iVar1) goto LAB_009e46ab;
  }
  local_c8[0] = (internal)0x1;
  local_108[0] = (internal)local_60.field_0._impl_.data_;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_a8,"static_cast<bool>(data)","msg2.data()",(bool *)local_c8,
             (bool *)local_108);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)local_a0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x433,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if ((long *)CONCAT71(local_c8._1_7_,local_c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c8._1_7_,local_c8[0]) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_a0.ptr_);
    }
    goto LAB_009e46ab;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0.ptr_)
    ;
  }
  proto2_unittest::Uint64Message::Uint64Message((Uint64Message *)local_a8,(Arena *)0x0);
  data_00._M_str = local_80._M_dataplus._M_p;
  data_00._M_len = local_80._M_string_length;
  bVar2 = MessageLite::ParseFromString((MessageLite *)local_a8,data_00);
  local_108[0] = (internal)bVar2;
  local_100.ptr_ = 0;
  if (bVar2) {
LAB_009e41ca:
    local_108 = (undefined1  [8])0x100000000;
    local_e8 = (undefined1  [8])local_98._8_8_;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_c8,"static_cast<uint64_t>(data)","msg3.data()",
               (unsigned_long *)local_108,(unsigned_long *)local_e8);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_108);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar3 = *(char **)local_c0.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x438,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
      if (local_108 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_108 + 8))();
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_c0.ptr_);
      }
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_c0.ptr_);
      }
      proto2_unittest::Int32Message::Int32Message((Int32Message *)local_c8,(Arena *)0x0);
      data_01._M_str = local_80._M_dataplus._M_p;
      data_01._M_len = local_80._M_string_length;
      bVar2 = MessageLite::ParseFromString((MessageLite *)local_c8,data_01);
      local_e8[0] = (internal)bVar2;
      local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2) {
LAB_009e4307:
        local_e8 = (undefined1  [8])((ulong)local_e8 & 0xffffffff00000000);
        local_118.data_._0_4_ = local_b8._8_4_;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_108,"static_cast<int32_t>(data)","msg4.data()",(int *)local_e8,
                   (int *)&local_118);
        if (local_108[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_e8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar3 = *(char **)local_100.ptr_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_118,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x43d,pcVar3);
          testing::internal::AssertHelper::operator=(&local_118,(Message *)local_e8);
          testing::internal::AssertHelper::~AssertHelper(&local_118);
          if (local_e8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_e8 + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100.ptr_);
          }
        }
        else {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100.ptr_);
          }
          proto2_unittest::Uint32Message::Uint32Message((Uint32Message *)local_108,(Arena *)0x0);
          data_02._M_str = local_80._M_dataplus._M_p;
          data_02._M_len = local_80._M_string_length;
          bVar2 = MessageLite::ParseFromString((MessageLite *)local_108,data_02);
          local_118.data_._0_4_ = CONCAT31(local_118.data_._1_3_,bVar2);
          local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar2) {
LAB_009e444c:
            local_118.data_._0_4_ = 0;
            local_120.data_._0_4_ = local_f8._8_4_;
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)local_e8,"static_cast<uint32_t>(data)","msg5.data()",
                       (uint *)&local_118,(uint *)&local_120);
            if (local_e8[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_118);
              if (local_e0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = anon_var_dwarf_a12c75 + 5;
              }
              else {
                pcVar3 = (local_e0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_120,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                         ,0x442,pcVar3);
              testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
              testing::internal::AssertHelper::~AssertHelper(&local_120);
              if ((long *)CONCAT44(local_118.data_._4_4_,local_118.data_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_118.data_._4_4_,local_118.data_._0_4_) + 8))();
              }
            }
            if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_e0,local_e0);
            }
          }
          else {
            testing::Message::Message((Message *)&local_120);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_e8,(internal *)&local_118,
                       (AssertionResult *)"msg5.ParseFromString(serialized)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_88,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                       ,0x441,(char *)local_e8);
            testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_120);
            testing::internal::AssertHelper::~AssertHelper(&local_88);
            if (local_e8 != (undefined1  [8])&local_d8) {
              operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
            }
            if ((long *)CONCAT44(local_120.data_._4_4_,local_120.data_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_120.data_._4_4_,local_120.data_._0_4_) + 8))();
            }
            if (local_110 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_110,local_110);
            }
            if (bVar2) goto LAB_009e444c;
          }
          proto2_unittest::Uint32Message::~Uint32Message((Uint32Message *)local_108);
        }
      }
      else {
        testing::Message::Message((Message *)&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_108,(internal *)local_e8,
                   (AssertionResult *)"msg4.ParseFromString(serialized)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x43c,(char *)local_108);
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        if (local_108 != (undefined1  [8])&local_f8) {
          operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_118.data_._4_4_,local_118.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_118.data_._4_4_,local_118.data_._0_4_) + 8))();
        }
        if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_e0,local_e0);
        }
        if (bVar2) goto LAB_009e4307;
      }
      proto2_unittest::Int32Message::~Int32Message((Int32Message *)local_c8);
    }
  }
  else {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_108,
               (AssertionResult *)"msg3.ParseFromString(serialized)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x437,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
    }
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_e8 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_100.ptr_);
    }
    if (bVar2) goto LAB_009e41ca;
  }
  proto2_unittest::Uint64Message::~Uint64Message((Uint64Message *)local_a8);
LAB_009e46ab:
  proto2_unittest::BoolMessage::~BoolMessage(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  proto2_unittest::Int64Message::~Int64Message(&local_40);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, CompatibleTypes) {
  const int64_t data = 0x100000000LL;
  typename TestFixture::Int64Message msg1;
  msg1.set_data(data);
  std::string serialized;
  msg1.SerializeToString(&serialized);

  // Test int64 is compatible with bool
  typename TestFixture::BoolMessage msg2;
  ASSERT_TRUE(msg2.ParseFromString(serialized));
  ASSERT_EQ(static_cast<bool>(data), msg2.data());

  // Test int64 is compatible with uint64
  typename TestFixture::Uint64Message msg3;
  ASSERT_TRUE(msg3.ParseFromString(serialized));
  ASSERT_EQ(static_cast<uint64_t>(data), msg3.data());

  // Test int64 is compatible with int32
  typename TestFixture::Int32Message msg4;
  ASSERT_TRUE(msg4.ParseFromString(serialized));
  ASSERT_EQ(static_cast<int32_t>(data), msg4.data());

  // Test int64 is compatible with uint32
  typename TestFixture::Uint32Message msg5;
  ASSERT_TRUE(msg5.ParseFromString(serialized));
  ASSERT_EQ(static_cast<uint32_t>(data), msg5.data());
}